

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitGetGlobal(WasmBytecodeGenerator *this)

{
  RegSlot location_;
  WasmReaderBase *pWVar1;
  WasmRegisterSpace *this_00;
  RegSlot tmpReg;
  WasmRegisterSpace *regSpace;
  RegSlot slot;
  WasmType type;
  WasmGlobal *global;
  WasmBytecodeGenerator *pWStack_18;
  uint32 globalIndex;
  WasmBytecodeGenerator *this_local;
  EmitInfo info;
  
  pWStack_18 = this;
  pWVar1 = GetReader(this);
  global._4_4_ = (pWVar1->m_currentNode).field_1.brTable.numTargets;
  _slot = Js::WebAssemblyModule::GetGlobal(this->m_module,global._4_4_);
  regSpace._4_4_ = WasmGlobal::GetType(_slot);
  regSpace._0_4_ = Js::WebAssemblyModule::GetOffsetForGlobal(this->m_module,_slot);
  this_00 = GetRegisterSpace(this,regSpace._4_4_);
  location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,(WasmType *)((long)&regSpace + 4));
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,
             (ulong)EmitGetGlobal::globalOpcodes[(int)(regSpace._4_4_ - FirstLocalType)],
             (ulong)location_,1,(ulong)(uint)regSpace);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitGetGlobal()
{
    uint32 globalIndex = GetReader()->m_currentNode.var.num;
    WasmGlobal* global = m_module->GetGlobal(globalIndex);

    WasmTypes::WasmType type = global->GetType();

    Js::RegSlot slot = m_module->GetOffsetForGlobal(global);

    CompileAssert(WasmTypes::I32 == 1);
    CompileAssert(WasmTypes::I64 == 2);
    CompileAssert(WasmTypes::F32 == 3);
    CompileAssert(WasmTypes::F64 == 4);
    static const Js::OpCodeAsmJs globalOpcodes[] = {
        Js::OpCodeAsmJs::LdSlot_Int,
        Js::OpCodeAsmJs::LdSlot_Long,
        Js::OpCodeAsmJs::LdSlot_Flt,
        Js::OpCodeAsmJs::LdSlot_Db
    };

    WasmRegisterSpace* regSpace = GetRegisterSpace(type);
    Js::RegSlot tmpReg = regSpace->AcquireTmpRegister();
    EmitInfo info(tmpReg, type);

    m_writer->AsmSlot(globalOpcodes[type - 1], tmpReg, WasmBytecodeGenerator::ModuleEnvRegister, slot);

    return info;
}